

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O1

ValueDict * __thiscall MiniScript::Value::GetDict(ValueDict *__return_storage_ptr__,Value *this)

{
  anon_union_8_3_2f476f46_for_data aVar1;
  RefCountedStorage *pRVar2;
  
  if (this->type != Map) {
    _Error("Assert failed: type == ValueType::Map",
           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
           ,0x95);
  }
  if ((this->data).ref == (RefCountedStorage *)0x0) {
    pRVar2 = (RefCountedStorage *)operator_new(0x800);
    pRVar2->refCount = 1;
    pRVar2->_vptr_RefCountedStorage = (_func_int **)&PTR__DictionaryStorage_001d1200;
    memset(pRVar2 + 1,0,0x7f0);
    (this->data).ref = pRVar2;
  }
  aVar1 = this->data;
  __return_storage_ptr__->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
  __return_storage_ptr__->ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)aVar1;
  __return_storage_ptr__->isTemp = true;
  return __return_storage_ptr__;
}

Assistant:

ValueDict GetDict() { Assert(type == ValueType::Map); if (not data.ref) data.ref = new ValueDictStorage(); ValueDict d((ValueDictStorage*)(data.ref)); d.retain(); return d; }